

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_to_hex(REF_GRID ref_grid)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  REF_STATUS RVar4;
  int iVar5;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT hex [27];
  int local_254;
  int local_250;
  REF_INT cell_node;
  REF_INT cell_edge;
  REF_INT cell_face;
  REF_INT tet_edge_nodes [6];
  REF_INT local_228 [2];
  REF_INT tet_face_nodes [4];
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_CELL edg_cell;
  REF_GLOB global;
  REF_INT bar [27];
  REF_INT quad [27];
  REF_INT face_nodes [4];
  REF_INT nodes [27];
  int local_64;
  REF_INT cell;
  REF_INT i;
  REF_INT new_cell;
  REF_INT node;
  REF_INT edge;
  REF_INT face;
  REF_INT *face_node;
  REF_INT *edge_node;
  REF_FACE ref_face;
  REF_EDGE ref_edge;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  ref_cell = (REF_CELL)ref_grid->geom;
  ref_node = (REF_NODE)ref_grid;
  uVar3 = ref_edge_create((REF_EDGE *)&ref_face,ref_grid);
  if (uVar3 == 0) {
    uVar3 = ref_face_create((REF_FACE *)&edge_node,(REF_GRID)ref_node);
    if (uVar3 == 0) {
      if (ref_face->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x9f6,"ref_subdiv_to_hex","malloc edge_node of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        face_node = (REF_INT *)malloc((long)ref_face->n << 2);
        if (face_node == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x9f6,"ref_subdiv_to_hex","malloc edge_node of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_2 = 0; ref_private_macro_code_rss_2 < ref_face->n;
              ref_private_macro_code_rss_2 = ref_private_macro_code_rss_2 + 1) {
            face_node[ref_private_macro_code_rss_2] = -1;
          }
          if (*edge_node < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x9f7,"ref_subdiv_to_hex","malloc face_node of REF_INT negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            _edge = malloc((long)*edge_node << 2);
            if (_edge == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x9f7,"ref_subdiv_to_hex","malloc face_node of REF_INT NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_3 = 0; ref_private_macro_code_rss_3 < *edge_node;
                  ref_private_macro_code_rss_3 = ref_private_macro_code_rss_3 + 1) {
                *(undefined4 *)((long)_edge + (long)ref_private_macro_code_rss_3 * 4) = 0xffffffff;
              }
              for (new_cell = 0; new_cell < ref_face->n; new_cell = new_cell + 1) {
                uVar3 = ref_node_next_global((REF_NODE)ref_geom,(REF_GLOB *)&edg_cell);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x9fa,"ref_subdiv_to_hex",(ulong)uVar3,"next global");
                  return uVar3;
                }
                uVar3 = ref_node_add((REF_NODE)ref_geom,(REF_GLOB)edg_cell,&i);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x9fb,"ref_subdiv_to_hex",(ulong)uVar3,"edge node");
                  return uVar3;
                }
                face_node[new_cell] = i;
                uVar3 = ref_node_interpolate_edge
                                  ((REF_NODE)ref_geom,ref_face->f2n[new_cell << 1],
                                   ref_face->f2n[new_cell * 2 + 1],0.5,i);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x9ff,"ref_subdiv_to_hex",(ulong)uVar3,"new reals");
                  return uVar3;
                }
                lVar1._0_4_ = ref_cell[2].type;
                lVar1._4_4_ = ref_cell[2].last_node_is_an_id;
                if ((lVar1 != 0) &&
                   (uVar3 = ref_geom_add_constrain_midnode
                                      ((REF_GRID)ref_node,ref_face->f2n[new_cell << 1],
                                       ref_face->f2n[new_cell * 2 + 1],0.5,i), uVar3 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0xa04,"ref_subdiv_to_hex",(ulong)uVar3,"new geom");
                  return uVar3;
                }
              }
              ref_edge = (REF_EDGE)ref_node->part;
              for (node = 0; node < *edge_node; node = node + 1) {
                uVar3 = ref_node_next_global((REF_NODE)ref_geom,(REF_GLOB *)&edg_cell);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0xa09,"ref_subdiv_to_hex",(ulong)uVar3,"next global");
                  return uVar3;
                }
                uVar3 = ref_node_add((REF_NODE)ref_geom,(REF_GLOB)edg_cell,&i);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0xa0a,"ref_subdiv_to_hex",(ulong)uVar3,"face node");
                  return uVar3;
                }
                *(REF_INT *)((long)_edge + (long)node * 4) = i;
                for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
                  face_nodes[(long)local_64 + 2] =
                       *(REF_INT *)(*(long *)(edge_node + 2) + (long)(local_64 + node * 4) * 4);
                }
                nodes[1] = -1;
                uVar3 = ref_cell_with((REF_CELL)ref_edge,face_nodes + 2,nodes + 0x1a);
                if ((uVar3 != 0) && (uVar3 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0xa11,"ref_subdiv_to_hex",(ulong)uVar3,"find tri");
                  return uVar3;
                }
                if (nodes[0x1a] != -1) {
                  nodes[1] = (&(ref_edge[1].node)->n)[*(int *)&ref_edge->e2n * nodes[0x1a] + 3];
                }
                uVar3 = ref_node_interpolate_face
                                  ((REF_NODE)ref_geom,face_nodes[2],face_nodes[3],nodes[0],i);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0xa15,"ref_subdiv_to_hex",(ulong)uVar3,"interp new face node");
                  return uVar3;
                }
                lVar2._0_4_ = ref_cell[2].type;
                lVar2._4_4_ = ref_cell[2].last_node_is_an_id;
                if (((lVar2 != 0) && (nodes[1] != -1)) &&
                   (uVar3 = ref_geom_add_constrain_inside_midnode
                                      ((REF_GRID)ref_node,face_nodes + 2,i), uVar3 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0xa18,"ref_subdiv_to_hex",(ulong)uVar3,"geom constrain new face node");
                  return uVar3;
                }
              }
              ref_edge = (REF_EDGE)ref_node->ref_mpi;
              for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_edge[1].e2n + 4);
                  nodes[0x1a] = nodes[0x1a] + 1) {
                RVar4 = ref_cell_nodes((REF_CELL)ref_edge,nodes[0x1a],face_nodes + 2);
                if (RVar4 == 0) {
                  for (cell_node = 0; cell_node < *(int *)((long)&ref_edge->adj + 4);
                      cell_node = cell_node + 1) {
                    for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
                      quad[(long)local_64 + 0x1a] =
                           (&(ref_edge[1].node)->n)
                           [*(int *)(*(long *)(ref_edge + 1) + (long)(local_64 + cell_node * 4) * 4)
                            + *(int *)&ref_edge->e2n * nodes[0x1a]];
                    }
                    uVar3 = ref_face_with((REF_FACE)edge_node,quad + 0x1a,&node);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xa29,"ref_subdiv_to_hex",(ulong)uVar3,"find face");
                      printf("%d tri %d %d %d  %d\n",(ulong)(uint)nodes[0x1a],
                             (ulong)(uint)face_nodes[2],(ulong)(uint)face_nodes[3],
                             (ulong)(uint)nodes[0],(ulong)(uint)nodes[1]);
                      return uVar3;
                    }
                    if (node == -1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xa2a,"ref_subdiv_to_hex","tet face not found");
                      return 1;
                    }
                    local_228[cell_node] = *(REF_INT *)((long)_edge + (long)node * 4);
                  }
                  for (local_250 = 0; local_250 < *(int *)&ref_edge->adj; local_250 = local_250 + 1)
                  {
                    uVar3 = ref_edge_with((REF_EDGE)ref_face,
                                          (&(ref_edge[1].node)->n)
                                          [(&ref_edge->node->n)[local_250 << 1] +
                                           *(int *)&ref_edge->e2n * nodes[0x1a]],
                                          (&(ref_edge[1].node)->n)
                                          [(&ref_edge->node->n)[local_250 * 2 + 1] +
                                           *(int *)&ref_edge->e2n * nodes[0x1a]],&new_cell);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xa31,"ref_subdiv_to_hex",(ulong)uVar3,"find edge");
                      return uVar3;
                    }
                    if (new_cell == -1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xa32,"ref_subdiv_to_hex","tet edge not found");
                      return 1;
                    }
                    (&cell_edge)[local_250] = face_node[new_cell];
                  }
                  uVar3 = ref_node_next_global((REF_NODE)ref_geom,(REF_GLOB *)&edg_cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa36,"ref_subdiv_to_hex",(ulong)uVar3,"next global");
                    return uVar3;
                  }
                  uVar3 = ref_node_add((REF_NODE)ref_geom,(REF_GLOB)edg_cell,&i);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa37,"ref_subdiv_to_hex",(ulong)uVar3,"edge node");
                    return uVar3;
                  }
                  for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
                    ref_geom->face_seg_per_rad[local_64 + i * 0xf] = 0.0;
                    for (local_254 = 0; local_254 < *(int *)((long)&ref_edge->e2n + 4);
                        local_254 = local_254 + 1) {
                      iVar5 = local_64 + i * 0xf;
                      ref_geom->face_seg_per_rad[iVar5] =
                           ref_geom->face_seg_per_rad
                           [local_64 + face_nodes[(long)local_254 + 2] * 0xf] * 0.25 +
                           ref_geom->face_seg_per_rad[iVar5];
                    }
                  }
                  ref_private_macro_code_rss_10 = face_nodes[2];
                  ref_private_macro_code_rsb = cell_edge;
                  hex[0] = tet_face_nodes[1];
                  hex[1] = cell_face;
                  hex[2] = tet_edge_nodes[0];
                  hex[3] = tet_face_nodes[0];
                  hex[4] = i;
                  hex[5] = local_228[1];
                  uVar3 = ref_cell_add((REF_CELL)ref_node->old_n_global,
                                       &ref_private_macro_code_rss_10,&cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa48,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                    return uVar3;
                  }
                  ref_private_macro_code_rss_10 = face_nodes[3];
                  ref_private_macro_code_rsb = tet_edge_nodes[1];
                  hex[0] = tet_face_nodes[1];
                  hex[1] = cell_edge;
                  hex[2] = tet_edge_nodes[2];
                  hex[3] = local_228[0];
                  hex[4] = i;
                  hex[5] = tet_face_nodes[0];
                  uVar3 = ref_cell_add((REF_CELL)ref_node->old_n_global,
                                       &ref_private_macro_code_rss_10,&cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa52,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                    return uVar3;
                  }
                  ref_private_macro_code_rss_10 = nodes[0];
                  ref_private_macro_code_rsb = cell_face;
                  hex[0] = tet_face_nodes[1];
                  hex[1] = tet_edge_nodes[1];
                  hex[2] = tet_edge_nodes[3];
                  hex[3] = local_228[1];
                  hex[4] = i;
                  hex[5] = local_228[0];
                  uVar3 = ref_cell_add((REF_CELL)ref_node->old_n_global,
                                       &ref_private_macro_code_rss_10,&cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa5c,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                    return uVar3;
                  }
                  ref_private_macro_code_rss_10 = nodes[1];
                  ref_private_macro_code_rsb = tet_edge_nodes[2];
                  hex[0] = tet_face_nodes[0];
                  hex[1] = tet_edge_nodes[0];
                  hex[2] = tet_edge_nodes[3];
                  hex[3] = local_228[0];
                  hex[4] = i;
                  hex[5] = local_228[1];
                  uVar3 = ref_cell_add((REF_CELL)ref_node->old_n_global,
                                       &ref_private_macro_code_rss_10,&cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa66,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                    return uVar3;
                  }
                  uVar3 = ref_cell_remove((REF_CELL)ref_edge,nodes[0x1a]);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa68,"ref_subdiv_to_hex",(ulong)uVar3,"remove tet");
                    return uVar3;
                  }
                }
              }
              ref_edge = (REF_EDGE)ref_node->part;
              for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_edge[1].e2n + 4);
                  nodes[0x1a] = nodes[0x1a] + 1) {
                RVar4 = ref_cell_nodes((REF_CELL)ref_edge,nodes[0x1a],face_nodes + 2);
                if (RVar4 == 0) {
                  for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
                    quad[(long)local_64 + 0x1a] = face_nodes[(long)local_64 + 2];
                  }
                  face_nodes[1] = quad[0x1a];
                  uVar3 = ref_face_with((REF_FACE)edge_node,quad + 0x1a,&node);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa72,"ref_subdiv_to_hex",(ulong)uVar3,"find face");
                    printf("%d tri %d %d %d  %d\n",(ulong)(uint)nodes[0x1a],
                           (ulong)(uint)face_nodes[2],(ulong)(uint)face_nodes[3],
                           (ulong)(uint)nodes[0],(ulong)(uint)nodes[1]);
                    return uVar3;
                  }
                  if (node == -1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa73,"ref_subdiv_to_hex","tri face not found");
                    return 1;
                  }
                  i = *(REF_INT *)((long)_edge + (long)node * 4);
                  bar[(long)*(int *)(*(long *)&ref_node->naux + 0xc) + 0x1a] =
                       face_nodes[(long)ref_node->part[3] + 2];
                  bar[0x1a] = face_nodes[2];
                  uVar3 = ref_edge_with((REF_EDGE)ref_face,face_nodes[2],face_nodes[3],&new_cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa78,"ref_subdiv_to_hex",(ulong)uVar3,"find edge after");
                    return uVar3;
                  }
                  quad[0] = i;
                  uVar3 = ref_edge_with((REF_EDGE)ref_face,nodes[0],face_nodes[2],&new_cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa7b,"ref_subdiv_to_hex",(ulong)uVar3,"find edge before");
                    return uVar3;
                  }
                  quad[1] = face_node[new_cell];
                  uVar3 = ref_cell_add(*(REF_CELL *)&ref_node->naux,bar + 0x1a,&cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa7d,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                    return uVar3;
                  }
                  bar[0x1a] = face_nodes[3];
                  uVar3 = ref_edge_with((REF_EDGE)ref_face,face_nodes[3],nodes[0],&new_cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa7f,"ref_subdiv_to_hex",(ulong)uVar3,"find edge after");
                    return uVar3;
                  }
                  quad[0] = i;
                  uVar3 = ref_edge_with((REF_EDGE)ref_face,face_nodes[2],face_nodes[3],&new_cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa82,"ref_subdiv_to_hex",(ulong)uVar3,"find edge before");
                    return uVar3;
                  }
                  quad[1] = face_node[new_cell];
                  uVar3 = ref_cell_add(*(REF_CELL *)&ref_node->naux,bar + 0x1a,&cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa84,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                    return uVar3;
                  }
                  bar[0x1a] = nodes[0];
                  uVar3 = ref_edge_with((REF_EDGE)ref_face,nodes[0],face_nodes[2],&new_cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa86,"ref_subdiv_to_hex",(ulong)uVar3,"find edge after");
                    return uVar3;
                  }
                  quad[0] = i;
                  uVar3 = ref_edge_with((REF_EDGE)ref_face,face_nodes[3],nodes[0],&new_cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa89,"ref_subdiv_to_hex",(ulong)uVar3,"find edge before");
                    return uVar3;
                  }
                  quad[1] = face_node[new_cell];
                  uVar3 = ref_cell_add(*(REF_CELL *)&ref_node->naux,bar + 0x1a,&cell);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa8b,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                    return uVar3;
                  }
                  uVar3 = ref_cell_remove((REF_CELL)ref_edge,nodes[0x1a]);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xa8c,"ref_subdiv_to_hex",(ulong)uVar3,"remove tri");
                    return uVar3;
                  }
                }
              }
              ref_edge = (REF_EDGE)ref_node->global;
              uVar3 = ref_cell_create((REF_CELL *)&ref_private_macro_code_rss_1,REF_CELL_EDG);
              if (uVar3 == 0) {
                for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)&ref_edge[1].e2n + 4);
                    nodes[0x1a] = nodes[0x1a] + 1) {
                  RVar4 = ref_cell_nodes((REF_CELL)ref_edge,nodes[0x1a],face_nodes + 2);
                  if (RVar4 == 0) {
                    bar[(long)*(int *)((long)ref_node->global + 0xc) + -2] =
                         face_nodes[(long)*(int *)((long)ref_node->global + 0xc) + 2];
                    global._0_4_ = face_nodes[2];
                    uVar3 = ref_edge_with((REF_EDGE)ref_face,face_nodes[2],face_nodes[3],&new_cell);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xa95,"ref_subdiv_to_hex",(ulong)uVar3,"find edge");
                      return uVar3;
                    }
                    global._4_4_ = face_node[new_cell];
                    uVar3 = ref_cell_add(_ref_private_macro_code_rss_1,(REF_INT *)&global,&cell);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xa97,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                      return uVar3;
                    }
                    global._0_4_ = face_node[new_cell];
                    global._4_4_ = face_nodes[3];
                    uVar3 = ref_cell_add(_ref_private_macro_code_rss_1,(REF_INT *)&global,&cell);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xa9a,"ref_subdiv_to_hex",(ulong)uVar3,"add");
                      return uVar3;
                    }
                  }
                }
                uVar3 = ref_cell_free((REF_CELL)ref_node->global);
                if (uVar3 == 0) {
                  ref_node->global = (REF_GLOB *)_ref_private_macro_code_rss_1;
                  if (_edge != (void *)0x0) {
                    free(_edge);
                  }
                  if (face_node != (REF_INT *)0x0) {
                    free(face_node);
                  }
                  uVar3 = ref_face_free((REF_FACE)edge_node);
                  if (uVar3 == 0) {
                    uVar3 = ref_edge_free((REF_EDGE)ref_face);
                    if (uVar3 == 0) {
                      ref_grid_local._4_4_ = ref_node_synchronize_globals((REF_NODE)ref_geom);
                      if (ref_grid_local._4_4_ == 0) {
                        ref_grid_local._4_4_ = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0xaa4,"ref_subdiv_to_hex",(ulong)ref_grid_local._4_4_,"sync globals"
                              );
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0xaa2,"ref_subdiv_to_hex",(ulong)uVar3,"free edge");
                      ref_grid_local._4_4_ = uVar3;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0xaa1,"ref_subdiv_to_hex",(ulong)uVar3,"free face");
                    ref_grid_local._4_4_ = uVar3;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0xa9c,"ref_subdiv_to_hex",(ulong)uVar3,"free old edge");
                  ref_grid_local._4_4_ = uVar3;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0xa90,"ref_subdiv_to_hex",(ulong)uVar3,"new edges");
                ref_grid_local._4_4_ = uVar3;
              }
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x9f5,"ref_subdiv_to_hex",(ulong)uVar3,"create face");
      ref_grid_local._4_4_ = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x9f4,
           "ref_subdiv_to_hex",(ulong)uVar3,"create edge");
    ref_grid_local._4_4_ = uVar3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_to_hex(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_FACE ref_face;
  REF_INT *edge_node, *face_node, face, edge, node, new_cell, i;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[4];
  REF_INT quad[REF_CELL_MAX_SIZE_PER], bar[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_CELL edg_cell;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_face_create(&ref_face, ref_grid), "create face");
  ref_malloc_init(edge_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(face_node, ref_face_n(ref_face), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    edge_node[edge] = node;
    RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
        "new reals");
    if (ref_geom_model_loaded(ref_geom))
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new geom");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_face(ref_face, face) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "face node");
    face_node[face] = node;

    for (i = 0; i < 3; i++) {
      nodes[i] = ref_face_f2n(ref_face, i, face);
    }
    nodes[3] = REF_EMPTY;
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find tri");
    if (REF_EMPTY != cell) nodes[3] = ref_cell_c2n(ref_cell, 3, cell);

    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "interp new face node");
    if (ref_geom_model_loaded(ref_geom) && REF_EMPTY != nodes[3]) {
      RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
          "geom constrain new face node");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT tet_face_nodes[4], tet_edge_nodes[6];
    REF_INT cell_face, cell_edge, cell_node;
    REF_INT hex[REF_CELL_MAX_SIZE_PER];

    each_ref_cell_cell_face(ref_cell, cell_face) {
      /* repeat first node to mark tri */
      for (i = 0; i < 4; i++)
        face_nodes[i] = ref_cell_f2n(ref_cell, i, cell_face, cell);
      RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
        printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
               nodes[3]);
      });
      RUS(REF_EMPTY, face, "tet face not found");
      tet_face_nodes[cell_face] = face_node[face];
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                        ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
          "find edge");
      RUS(REF_EMPTY, edge, "tet edge not found");
      tet_edge_nodes[cell_edge] = edge_node[edge];
    }

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "edge node");
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = 0.0;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_node_xyz(ref_node, i, node) +=
            0.25 * ref_node_xyz(ref_node, i, nodes[cell_node]);
      }
    }

    hex[0] = nodes[0];
    hex[1] = tet_edge_nodes[0];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[1];
    hex[4] = tet_edge_nodes[2];
    hex[5] = tet_face_nodes[2];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[1];
    hex[1] = tet_edge_nodes[3];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[0];
    hex[4] = tet_edge_nodes[4];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[2];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[2];
    hex[1] = tet_edge_nodes[1];
    hex[2] = tet_face_nodes[3];
    hex[3] = tet_edge_nodes[3];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[1];
    hex[6] = node;
    hex[7] = tet_face_nodes[0];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    hex[0] = nodes[3];
    hex[1] = tet_edge_nodes[4];
    hex[2] = tet_face_nodes[2];
    hex[3] = tet_edge_nodes[2];
    hex[4] = tet_edge_nodes[5];
    hex[5] = tet_face_nodes[0];
    hex[6] = node;
    hex[7] = tet_face_nodes[1];
    RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &new_cell), "add");

    RSS(ref_cell_remove(ref_cell, cell), "remove tet");
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = nodes[i];
    face_nodes[3] = face_nodes[0]; /* repeat first node to mark tri */
    RSB(ref_face_with(ref_face, face_nodes, &face), "find face", {
      printf("%d tri %d %d %d  %d\n", cell, nodes[0], nodes[1], nodes[2],
             nodes[3]);
    });
    RUS(REF_EMPTY, face, "tri face not found");
    node = face_node[face];
    quad[ref_cell_id_index(ref_grid_qua(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];
    quad[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[1];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    quad[0] = nodes[2];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge after");
    quad[1] = edge_node[edge];
    quad[2] = node;
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge before");
    quad[3] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &new_cell), "add");
    RSS(ref_cell_remove(ref_cell, cell), "remove tri");
  }

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_create(&edg_cell, REF_CELL_EDG), "new edges");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    bar[ref_cell_id_index(ref_grid_edg(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];
    bar[0] = nodes[0];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge");
    bar[1] = edge_node[edge];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
    bar[0] = edge_node[edge];
    bar[1] = nodes[1];
    RSS(ref_cell_add(edg_cell, bar, &new_cell), "add");
  }
  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "free old edge");
  ref_grid_edg(ref_grid) = edg_cell;

  ref_free(face_node);
  ref_free(edge_node);
  RSS(ref_face_free(ref_face), "free face");
  RSS(ref_edge_free(ref_edge), "free edge");

  RSS(ref_node_synchronize_globals(ref_node), "sync globals");

  return REF_SUCCESS;
}